

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O1

route_type_t parse_route_type(char *value)

{
  int iVar1;
  route_type_t rVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    rVar2 = RT_STREET_LEVEL;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      rVar2 = RT_UNDERGROUND;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        rVar2 = RT_LONG_RAIL;
      }
      else {
        iVar1 = strcmp(value,"3");
        if (iVar1 == 0) {
          rVar2 = RT_BUS;
        }
        else {
          iVar1 = strcmp(value,"4");
          if (iVar1 == 0) {
            rVar2 = RT_FERRY;
          }
          else {
            iVar1 = strcmp(value,"5");
            if (iVar1 == 0) {
              rVar2 = RT_CABLE_CAR;
            }
            else {
              iVar1 = strcmp(value,"6");
              if (iVar1 == 0) {
                rVar2 = RT_SUSPENDED;
              }
              else {
                iVar1 = strcmp(value,"7");
                rVar2 = RT_NOT_SET - (iVar1 == 0);
              }
            }
          }
        }
      }
    }
  }
  return rVar2;
}

Assistant:

route_type_t parse_route_type(const char *value) {
    if (strcmp(value, "0") == 0)
        return RT_STREET_LEVEL;
    else if (strcmp(value, "1") == 0)
        return RT_UNDERGROUND;
    else if (strcmp(value, "2") == 0)
        return RT_LONG_RAIL;
    else if (strcmp(value, "3") == 0)
        return RT_BUS;
    else if (strcmp(value, "4") == 0)
        return RT_FERRY;
    else if (strcmp(value, "5") == 0)
        return RT_CABLE_CAR;
    else if (strcmp(value, "6") == 0)
        return RT_SUSPENDED;
    else if (strcmp(value, "7") == 0)
        return RT_FUNICULAR;
    else
        return RT_NOT_SET;
}